

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::CompactReporter::sectionEnded(CompactReporter *this,SectionStats *_sectionStats)

{
  bool bVar1;
  ostream *poVar2;
  SectionStats *this_00;
  char local_41;
  double local_40;
  string local_38;
  
  local_40 = _sectionStats->durationInSeconds;
  this_00 = _sectionStats;
  bVar1 = shouldShowDuration((this->super_StreamingReporterBase<Catch::CompactReporter>).m_config.
                             super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,local_40);
  if (bVar1) {
    poVar2 = (ostream *)(this->super_StreamingReporterBase<Catch::CompactReporter>).stream;
    getFormattedDuration_abi_cxx11_(&local_38,(Catch *)this_00,local_40);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_38._M_dataplus._M_p,local_38._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," s: ",4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(_sectionStats->sectionInfo).name._M_dataplus._M_p,
                        (_sectionStats->sectionInfo).name._M_string_length);
    local_41 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_41,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void CompactReporter::sectionEnded(SectionStats const& _sectionStats) {
            double dur = _sectionStats.durationInSeconds;
            if ( shouldShowDuration( *m_config, dur ) ) {
                stream << getFormattedDuration( dur ) << " s: " << _sectionStats.sectionInfo.name << '\n';
            }
        }